

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_stdio.c
# Opt level: O2

int log_policy_stream_stdio_write(log_policy policy,void *buffer,size_t size)

{
  undefined8 *puVar1;
  size_t sVar2;
  size_t __n;
  
  puVar1 = (undefined8 *)log_policy_instance(policy);
  __n = 0;
  if (size != 0) {
    __n = size - 1;
  }
  sVar2 = fwrite(buffer,1,__n,(FILE *)*puVar1);
  return (int)(sVar2 != __n);
}

Assistant:

static int log_policy_stream_stdio_write(log_policy policy, const void *buffer, const size_t size)
{
	log_policy_stream_stdio_data stdio_data = log_policy_instance(policy);

	size_t length = size > 0 ? size - 1 : 0;

	/* Do not write null character */
	if (fwrite(buffer, 1, length, stdio_data->stream) != length)
	{
		return 1;
	}

	return 0;
}